

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest12::getTestCaseString_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest12 *this,_test_case *test_case)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_11)
  ;
  if (*test_case < TEST_CASE_COUNT) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest12::getTestCaseString(const _test_case& test_case)
{
	std::string result = "?";

	switch (test_case)
	{
	case TEST_CASE_INVALID_LOCAL_SUBROUTINE_VARIABLE:
		result = "TEST_CASE_INVALID_LOCAL_SUBROUTINE_VARIABLE";
		break;
	case TEST_CASE_INVALID_GLOBAL_SUBROUTINE_VARIABLE:
		result = "TEST_CASE_INVALID_GLOBAL_SUBROUTINE_VARIABLE";
		break;
	case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR:
		result = "TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR";
		break;
	case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_ARGUMENT:
		result = "TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_ARGUMENT";
		break;
	case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_RETURN_TYPE:
		result = "TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_RETURN_TYPE";
		break;
	default:
		break;
	}

	return result;
}